

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O0

string * __thiscall
cmTimestamp::FileModificationTime
          (string *__return_storage_ptr__,cmTimestamp *this,char *path,string *formatString,
          bool utcFlag)

{
  bool bVar1;
  long timeT;
  string local_b0;
  long local_90;
  time_t mtime;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  string real_path;
  bool utcFlag_local;
  string *formatString_local;
  char *path_local;
  cmTimestamp *this_local;
  
  real_path.field_2._M_local_buf[0xf] = utcFlag;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,path,&local_71);
  cmSystemTools::GetRealPathResolvingWindowsSubst((string *)local_50,&local_70,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_50);
  if (bVar1) {
    timeT = cmsys::SystemTools::ModifiedTime((string *)local_50);
    local_90 = timeT;
    std::__cxx11::string::string((string *)&local_b0,(string *)formatString);
    CreateTimestampFromTimeT
              (__return_storage_ptr__,this,timeT,&local_b0,
               (bool)(real_path.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  mtime._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::FileModificationTime(const char* path,
                                              const std::string& formatString,
                                              bool utcFlag)
{
  std::string real_path =
    cmSystemTools::GetRealPathResolvingWindowsSubst(path);

  if (!cmsys::SystemTools::FileExists(real_path)) {
    return std::string();
  }

  time_t mtime = cmsys::SystemTools::ModifiedTime(real_path);
  return CreateTimestampFromTimeT(mtime, formatString, utcFlag);
}